

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O0

void __thiscall MT32Emu::PartialManager::polyFreed(PartialManager *this,Poly *poly)

{
  Part *this_00;
  uint local_2c;
  Poly *pPStack_28;
  Bit32u polyCount;
  Poly *activePoly;
  Bit32u partNum;
  Poly *poly_local;
  PartialManager *this_local;
  
  if (this->firstFreePolyIndex == 0) {
    Synth::printDebug(this->synth,
                      "PartialManager Error: Cannot return freed poly, currently active polys:\n");
    for (activePoly._4_4_ = 0; activePoly._4_4_ < 9; activePoly._4_4_ = activePoly._4_4_ + 1) {
      this_00 = Synth::getPart(this->synth,(Bit8u)activePoly._4_4_);
      pPStack_28 = Part::getFirstActivePoly(this_00);
      local_2c = 0;
      while (pPStack_28 != (Poly *)0x0) {
        pPStack_28 = Poly::getNext(pPStack_28);
        local_2c = local_2c + 1;
      }
      Synth::printDebug(this->synth,"Part: %i, active poly count: %i\n",(ulong)activePoly._4_4_,
                        (ulong)local_2c);
    }
  }
  else {
    this->firstFreePolyIndex = this->firstFreePolyIndex - 1;
    this->freePolys[this->firstFreePolyIndex] = poly;
  }
  Poly::setPart(poly,(Part *)0x0);
  return;
}

Assistant:

void PartialManager::polyFreed(Poly *poly) {
	if (0 == firstFreePolyIndex) {
		synth->printDebug("PartialManager Error: Cannot return freed poly, currently active polys:\n");
		for (Bit32u partNum = 0; partNum < 9; partNum++) {
			const Poly *activePoly = synth->getPart(partNum)->getFirstActivePoly();
			Bit32u polyCount = 0;
			while (activePoly != NULL) {
				activePoly = activePoly->getNext();
				polyCount++;
			}
			synth->printDebug("Part: %i, active poly count: %i\n", partNum, polyCount);
		}
	} else {
		firstFreePolyIndex--;
		freePolys[firstFreePolyIndex] = poly;
	}
	poly->setPart(NULL);
}